

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O2

void chirc_ctx_add_connection(chirc_ctx_t *ctx,chirc_connection_t *conn)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  UT_hash_handle *pUVar3;
  UT_hash_handle *pUVar4;
  UT_hash_table *pUVar5;
  UT_hash_bucket *__ptr;
  UT_hash_bucket *pUVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  UT_hash_handle *pUVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  uVar7 = conn->socket + 0x112410dU ^ 0x7f76d;
  uVar8 = uVar7 << 8 ^ 0x9f49bac6 - uVar7;
  uVar10 = uVar8 >> 0xd ^ (-0x112410d - uVar7) - uVar8;
  uVar12 = uVar10 >> 0xc ^ (uVar7 - uVar8) - uVar10;
  uVar7 = uVar12 << 0x10 ^ (uVar8 - uVar10) - uVar12;
  uVar8 = uVar7 >> 5 ^ (uVar10 - uVar12) - uVar7;
  uVar10 = uVar8 >> 3 ^ (uVar12 - uVar7) - uVar8;
  uVar7 = uVar10 << 10 ^ (uVar7 - uVar8) - uVar10;
  uVar7 = uVar7 >> 0xf ^ uVar8 - (uVar10 + uVar7);
  pUVar1 = &conn->hh;
  (conn->hh).hashv = uVar7;
  (conn->hh).key = &conn->socket;
  (conn->hh).keylen = 4;
  if (ctx->connections == (chirc_connection_t *)0x0) {
    pUVar5 = (UT_hash_table *)calloc(1,0x40);
    (conn->hh).prev = (void *)0x0;
    (conn->hh).next = (void *)0x0;
    (conn->hh).tbl = pUVar5;
    if (pUVar5 == (UT_hash_table *)0x0) goto LAB_00103674;
    pUVar5->tail = pUVar1;
    pUVar5->num_buckets = 0x20;
    pUVar5->log2_num_buckets = 5;
    pUVar5->hho = 0x28;
    __ptr = (UT_hash_bucket *)calloc(1,0x200);
    pUVar5->buckets = __ptr;
    pUVar5->signature = 0xa0111fe1;
    if (__ptr == (UT_hash_bucket *)0x0) goto LAB_00103674;
    ctx->connections = conn;
    uVar8 = 0x20;
  }
  else {
    pUVar5 = (ctx->connections->hh).tbl;
    (conn->hh).tbl = pUVar5;
    (conn->hh).next = (void *)0x0;
    pUVar11 = pUVar5->tail;
    (conn->hh).prev = (void *)((long)pUVar11 - pUVar5->hho);
    pUVar11->next = conn;
    pUVar5->tail = pUVar1;
    uVar8 = pUVar5->num_buckets;
    __ptr = pUVar5->buckets;
  }
  uVar12 = pUVar5->num_items + 1;
  pUVar5->num_items = uVar12;
  uVar7 = uVar8 - 1 & uVar7;
  uVar10 = __ptr[uVar7].count + 1;
  __ptr[uVar7].count = uVar10;
  pUVar11 = __ptr[uVar7].hh_head;
  (conn->hh).hh_next = pUVar11;
  (conn->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar11 != (UT_hash_handle *)0x0) {
    pUVar11->hh_prev = pUVar1;
  }
  __ptr[uVar7].hh_head = pUVar1;
  if ((__ptr[uVar7].expand_mult * 10 + 10 <= uVar10) && (pUVar5->noexpand == 0)) {
    pUVar6 = (UT_hash_bucket *)calloc(1,(ulong)uVar8 << 5);
    if (pUVar6 == (UT_hash_bucket *)0x0) {
LAB_00103674:
      exit(-1);
    }
    uVar7 = uVar8 * 2 - 1;
    uVar12 = ((uVar12 >> ((char)pUVar5->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar7 & uVar12) == 0);
    pUVar5->ideal_chain_maxlen = uVar12;
    pUVar5->nonideal_items = 0;
    uVar10 = 0;
    for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      pUVar11 = __ptr[uVar9].hh_head;
      while (pUVar11 != (UT_hash_handle *)0x0) {
        pUVar3 = pUVar11->hh_next;
        uVar14 = pUVar11->hashv & uVar7;
        pUVar2 = pUVar6 + uVar14;
        uVar13 = pUVar6[uVar14].count + 1;
        pUVar6[uVar14].count = uVar13;
        if (uVar12 < uVar13) {
          uVar10 = uVar10 + 1;
          pUVar5->nonideal_items = uVar10;
          if (pUVar2->expand_mult * uVar12 < uVar13) {
            pUVar2->expand_mult = pUVar2->expand_mult + 1;
          }
        }
        pUVar11->hh_prev = (UT_hash_handle *)0x0;
        pUVar4 = pUVar2->hh_head;
        pUVar11->hh_next = pUVar4;
        if (pUVar4 != (UT_hash_handle *)0x0) {
          pUVar4->hh_prev = pUVar11;
        }
        pUVar2->hh_head = pUVar11;
        pUVar11 = pUVar3;
      }
    }
    free(__ptr);
    pUVar5 = pUVar1->tbl;
    pUVar5->num_buckets = pUVar5->num_buckets << 1;
    pUVar5->log2_num_buckets = pUVar5->log2_num_buckets + 1;
    pUVar5->buckets = pUVar6;
    if (pUVar5->num_items >> 1 < pUVar5->nonideal_items) {
      uVar7 = pUVar5->ineff_expands + 1;
      pUVar5->ineff_expands = uVar7;
      if (1 < uVar7) {
        pUVar5->noexpand = 1;
      }
    }
    else {
      pUVar5->ineff_expands = 0;
    }
  }
  return;
}

Assistant:

void chirc_ctx_add_connection(chirc_ctx_t *ctx, chirc_connection_t *conn)
{
    HASH_ADD_INT(ctx->connections, socket, conn);
}